

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_notif(lys_module *module,lys_node_notif *notif,lys_node **child,int options,
                    unres_schema *unres)

{
  int iVar1;
  unres_schema *unres_local;
  int options_local;
  lys_node **child_local;
  lys_node_notif *notif_local;
  lys_module *module_local;
  
  iVar1 = yang_check_typedef(module,(lys_node *)notif,unres);
  if ((iVar1 == 0) &&
     (iVar1 = yang_check_iffeatures(module,(void *)0x0,notif,NOTIFICATION_KEYWORD,unres), iVar1 == 0
     )) {
    iVar1 = yang_check_nodes(module,(lys_node *)notif,*child,options | 2,unres);
    if (iVar1 == 0) {
      *child = (lys_node *)0x0;
      iVar1 = yang_check_must(module,notif->must,(uint)notif->must_size,unres);
      if (iVar1 == 0) {
        if (notif->must_size == '\0') {
          return 0;
        }
        if ((options & 4U) == 0) {
          iVar1 = unres_schema_add_node(module,unres,notif,UNRES_XPATH,(lys_node *)0x0);
          if (iVar1 != -1) {
            return 0;
          }
        }
        else {
          iVar1 = lyxp_node_check_syntax((lys_node *)notif);
          if (iVar1 == 0) {
            return 0;
          }
        }
      }
    }
    else {
      *child = (lys_node *)0x0;
    }
  }
  return 1;
}

Assistant:

static int
yang_check_notif(struct lys_module *module, struct lys_node_notif *notif, struct lys_node **child,
                 int options, struct unres_schema *unres)
{
    if (yang_check_typedef(module, (struct lys_node *)notif, unres)) {
        goto error;
    }

    if (yang_check_iffeatures(module, NULL, notif, NOTIFICATION_KEYWORD, unres)) {
        goto error;
    }

    if (yang_check_nodes(module, (struct lys_node *)notif, *child, options | LYS_PARSE_OPT_CFG_IGNORE, unres)) {
        *child = NULL;
        goto error;
    }
    *child = NULL;

    if (yang_check_must(module, notif->must, notif->must_size, unres)) {
        goto error;
    }

    /* check XPath dependencies */
    if (notif->must_size) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax((struct lys_node *)notif)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, notif, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;
error:
    return EXIT_FAILURE;
}